

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void cereal::
     load<cereal::BinaryInputArchive,std::variant<eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>
               (BinaryInputArchive *ar,
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               *optional)

{
  bool bVar1;
  BinaryInputArchive *ar_00;
  Exception *this;
  bool nullopt;
  char local_1d;
  int local_1c;
  
  BinaryInputArchive::loadBinary
            ((((ar->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::BinaryInputArchive,_1U>).self,&local_1d,1);
  bVar1 = (optional->
          super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
          ._M_engaged;
  if (local_1d == '\x01') {
    if (bVar1 != false) {
      (optional->
      super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
      ._M_engaged = false;
      std::__detail::__variant::
      _Variant_storage<false,_eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
      ::~_Variant_storage((_Variant_storage<false,_eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                           *)optional);
    }
  }
  else {
    if (bVar1 != false) {
      (optional->
      super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
      ._M_engaged = false;
      std::__detail::__variant::
      _Variant_storage<false,_eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
      ::~_Variant_storage((_Variant_storage<false,_eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                           *)optional);
    }
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x60) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x68) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x50) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x58) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x40) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x48) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x30) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x38) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x20) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x28) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x10) = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 0x18) = 0;
    *(undefined8 *)
     &(optional->
      super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
      ._M_payload = 0;
    *(undefined8 *)
     ((long)&(optional->
             super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
             ._M_payload + 8) = 0;
    (optional->
    super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
    ._M_engaged = true;
    ar_00 = (((ar->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
            super_InputArchive<cereal::BinaryInputArchive,_1U>).self;
    BinaryInputArchive::loadBinary
              ((((ar_00->super_InputArchive<cereal::BinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::BinaryInputArchive,_1U>).self,&local_1c,4);
    if (1 < local_1c) {
      this = (Exception *)__cxa_allocate_exception(0x10);
      Exception::Exception(this,"Invalid \'index\' selector when deserializing std::variant");
      __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    std::enable_if<(0)<(std::variant_size_v<std::variant<eos::morphablemodel::PcaModel,std::
    vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>>),void>
    ::type_cereal::variant_detail::load_variant<0,std::variant<eos::morphablemodel::PcaModel,std::
    vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>,cereal
    ::BinaryInputArchive>
              (ar_00,local_1c,
               (variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
                *)optional);
  }
  return;
}

Assistant:

inline
  void CEREAL_LOAD_FUNCTION_NAME(Archive& ar, std::optional<T>& optional)
  {
    bool nullopt;
    ar(CEREAL_NVP_("nullopt", nullopt));

    if (nullopt) {
      optional = std::nullopt;
    } else {
      optional.emplace();
      ar(CEREAL_NVP_("data", *optional));
    }
  }